

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void ws_http_cb(void *arg)

{
  long lVar1;
  nni_aio *aio;
  _Bool _Var2;
  nng_err nVar3;
  nng_http_status nVar4;
  int iVar5;
  nni_aio *pnVar6;
  char *pcVar7;
  nni_list *mtx;
  char local_58 [32];
  nni_list *local_38;
  
  pnVar6 = (nni_aio *)((long)arg + 0x650);
  if (*(char *)((long)arg + 0x50) == '\x01') {
    lVar1 = *(long *)((long)arg + 0xa08);
    mtx = (nni_list *)(lVar1 + 0x60);
    nni_mtx_lock((nni_mtx *)mtx);
    nni_list_remove((nni_list *)(lVar1 + 0xd8),arg);
    nVar3 = nni_aio_result(pnVar6);
    if (nVar3 != NNG_OK) {
      nni_mtx_unlock((nni_mtx *)mtx);
      nni_reap(&ws_reap_list,arg);
      return;
    }
    *(undefined1 *)((long)arg + 0x53) = 1;
    local_38 = (nni_list *)(lVar1 + 0xf0);
    pnVar6 = (nni_aio *)nni_list_first(local_38);
    if (pnVar6 == (nni_aio *)0x0) {
      nni_list_append((nni_list *)(lVar1 + 0xc0),arg);
    }
    else {
      nni_list_remove(local_38,pnVar6);
      nni_aio_set_output(pnVar6,0,arg);
      nni_aio_finish(pnVar6,NNG_OK,0);
    }
    iVar5 = nni_list_empty((nni_list *)(lVar1 + 0xd8));
    if (iVar5 != 0) {
      nni_cv_wake((nni_cv *)(lVar1 + 0x88));
    }
LAB_0012eeaf:
    nni_mtx_unlock((nni_mtx *)mtx);
    return;
  }
  lVar1 = *(long *)((long)arg + 0xa10);
  local_38 = (nni_list *)(lVar1 + 0x58);
  nni_mtx_lock((nni_mtx *)local_38);
  aio = *(nni_aio **)((long)arg + 0x9e0);
  nVar3 = nni_aio_result(pnVar6);
  if ((aio == (nni_aio *)0x0 || nVar3 != NNG_OK) ||
     (nVar3 = NNG_ECLOSED, *(char *)(lVar1 + 0xe0) != '\0')) goto LAB_0012ed6b;
  if (*(char *)((long)arg + 0x59) == '\0') {
    *(undefined1 *)((long)arg + 0x59) = 1;
    nng_http_read_response(*(nng_http **)((long)arg + 0x9e8),pnVar6);
    mtx = local_38;
    goto LAB_0012eeaf;
  }
  nVar4 = nni_http_get_status(*(nng_http **)((long)arg + 0x9e8));
  nVar4 = nVar4 & 0xffff;
  if (nVar4 < NNG_HTTP_STATUS_NOT_FOUND) {
    if (nVar4 == NNG_HTTP_STATUS_SWITCHING) {
      nVar3 = ws_make_accept((char *)((long)arg + 0xa18),local_58);
      if (nVar3 != NNG_OK) goto LAB_0012ed6b;
      pcVar7 = nng_http_get_header(*(nng_http **)((long)arg + 0x9e8),"Sec-WebSocket-Accept");
      if ((((((pcVar7 != (char *)0x0) && (iVar5 = strcmp(pcVar7,local_58), iVar5 == 0)) &&
            (pcVar7 = nng_http_get_header(*(nng_http **)((long)arg + 0x9e8),"Connection"),
            pcVar7 != (char *)0x0)) &&
           ((_Var2 = ws_contains_word(pcVar7,"upgrade"), _Var2 &&
            (pcVar7 = nng_http_get_header(*(nng_http **)((long)arg + 0x9e8),"Upgrade"),
            pcVar7 != (char *)0x0)))) && (iVar5 = strcmp(pcVar7,"websocket"), iVar5 == 0)) &&
         ((*(long *)(lVar1 + 0xb8) == 0 ||
          ((pcVar7 = nng_http_get_header(*(nng_http **)((long)arg + 0x9e8),"Sec-WebSocket-Protocol")
           , pcVar7 != (char *)0x0 &&
           (_Var2 = ws_contains_word(*(char **)(lVar1 + 0xb8),pcVar7), _Var2)))))) {
        nni_list_remove((nni_list *)(lVar1 + 200),arg);
        *(undefined1 *)((long)arg + 0x53) = 1;
        *(undefined8 *)((long)arg + 0x9e0) = 0;
        *(undefined8 *)((long)arg + 0xa10) = 0;
        nni_aio_set_output(aio,0,arg);
        nni_aio_finish(aio,NNG_OK,0);
        iVar5 = nni_list_empty((nni_list *)(lVar1 + 200));
        if (iVar5 != 0) {
          nni_cv_wake((nni_cv *)(lVar1 + 0x80));
        }
        nni_mtx_unlock((nni_mtx *)local_38);
        return;
      }
      ws_close_error((nni_ws *)arg,0x3ea);
    }
    else {
      nVar3 = NNG_EPERM;
      if ((nVar4 == NNG_HTTP_STATUS_UNAUTHORIZED) || (nVar4 == NNG_HTTP_STATUS_FORBIDDEN))
      goto LAB_0012ed6b;
    }
  }
  else if ((nVar4 - NNG_HTTP_STATUS_NOT_FOUND < 2) || (nVar4 == NNG_HTTP_STATUS_NOT_IMPLEMENTED)) {
    nVar3 = NNG_ECONNREFUSED;
    goto LAB_0012ed6b;
  }
  nVar3 = NNG_EPROTO;
LAB_0012ed6b:
  nni_list_remove((nni_list *)(lVar1 + 200),arg);
  *(undefined8 *)((long)arg + 0x9e0) = 0;
  *(undefined8 *)((long)arg + 0xa10) = 0;
  iVar5 = nni_list_empty((nni_list *)(lVar1 + 200));
  if (iVar5 != 0) {
    nni_cv_wake((nni_cv *)(lVar1 + 0x80));
  }
  if (aio != (nni_aio *)0x0) {
    nni_aio_finish_error(aio,nVar3);
  }
  nni_mtx_unlock((nni_mtx *)local_38);
  nni_reap(&ws_reap_list,arg);
  return;
}

Assistant:

static void
ws_http_cb(void *arg)
{
	nni_ws  *ws  = arg;
	nni_aio *aio = &ws->httpaio;

	if (ws->server) {
		ws_http_cb_listener(ws, aio);
	} else {
		ws_http_cb_dialer(ws, aio);
	}
}